

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool Fossilize::Hashing::compute_hash_render_pass2
               (VkRenderPassCreateInfo2 *create_info,Hash *out_hash)

{
  VkAttachmentDescription2 *pVVar1;
  VkSubpassDependency2 *pVVar2;
  VkSubpassDescription2 *pVVar3;
  bool bVar4;
  long lVar5;
  uint32_t i;
  ulong uVar6;
  ulong uVar7;
  Hasher local_48;
  ulong local_40;
  ulong *local_38;
  
  local_48.h = ((((((ulong)create_info->flags ^ 0xaf63bd4c8601b7df) * 0x100000001b3 ^
                  (ulong)create_info->attachmentCount) * 0x100000001b3 ^
                 (ulong)create_info->dependencyCount) * 0x100000001b3 ^
                (ulong)create_info->subpassCount) * 0x100000001b3 ^
               (ulong)create_info->correlatedViewMaskCount) * 0x100000001b3 ^ 2;
  uVar7 = 0xffffffffffffffff;
  lVar5 = 0x30;
  local_38 = out_hash;
  while (uVar7 = uVar7 + 1, uVar7 < create_info->attachmentCount) {
    pVVar1 = create_info->pAttachments;
    local_48.h = ((((((((local_48.h * 0x100000001b3 ^ (ulong)*(uint *)((long)pVVar1 + lVar5 + -0x20)
                        ) * 0x100000001b3 ^ (ulong)*(uint *)((long)pVVar1 + lVar5 + -4)) *
                       0x100000001b3 ^ (ulong)*(uint *)((long)&pVVar1->sType + lVar5)) *
                      0x100000001b3 ^ (ulong)*(uint *)((long)pVVar1 + lVar5 + -0x1c)) *
                     0x100000001b3 ^ (ulong)*(uint *)((long)pVVar1 + lVar5 + -0x14)) * 0x100000001b3
                   ^ (ulong)*(uint *)((long)pVVar1 + lVar5 + -0x10)) * 0x100000001b3 ^
                  (ulong)*(uint *)((long)pVVar1 + lVar5 + -0xc)) * 0x100000001b3 ^
                 (ulong)*(uint *)((long)pVVar1 + lVar5 + -8)) * 0x100000001b3 ^
                 (ulong)*(uint *)((long)pVVar1 + lVar5 + -0x18);
    bVar4 = hash_pnext_chain((StateRecorder *)0x0,&local_48,*(void **)((long)pVVar1 + lVar5 + -0x28)
                             ,(DynamicStateInfo *)0x0,0);
    lVar5 = lVar5 + 0x38;
    if (!bVar4) {
      return false;
    }
  }
  uVar7 = 0xffffffffffffffff;
  lVar5 = 0x2c;
  while (uVar7 = uVar7 + 1, uVar7 < create_info->dependencyCount) {
    pVVar2 = create_info->pDependencies;
    local_48.h = (((((((local_48.h * 0x100000001b3 ^ (ulong)*(uint *)((long)pVVar2 + lVar5 + -4)) *
                       0x100000001b3 ^ (ulong)*(uint *)((long)pVVar2 + lVar5 + -8)) * 0x100000001b3
                     ^ (ulong)*(uint *)((long)pVVar2 + lVar5 + -0xc)) * 0x100000001b3 ^
                    (ulong)*(uint *)((long)pVVar2 + lVar5 + -0x1c)) * 0x100000001b3 ^
                   (ulong)*(uint *)((long)pVVar2 + lVar5 + -0x18)) * 0x100000001b3 ^
                  (ulong)*(uint *)((long)pVVar2 + lVar5 + -0x14)) * 0x100000001b3 ^
                 (ulong)*(uint *)((long)pVVar2 + lVar5 + -0x10)) * 0x100000001b3 ^
                 (ulong)*(uint *)((long)&pVVar2->sType + lVar5);
    bVar4 = hash_pnext_chain((StateRecorder *)0x0,&local_48,*(void **)((long)pVVar2 + lVar5 + -0x24)
                             ,(DynamicStateInfo *)0x0,0);
    lVar5 = lVar5 + 0x30;
    if (!bVar4) {
      return false;
    }
  }
  local_40 = 0;
  do {
    uVar7 = local_40;
    if (create_info->subpassCount <= local_40) {
      for (uVar7 = 0; create_info->correlatedViewMaskCount != uVar7; uVar7 = uVar7 + 1) {
        local_48.h = local_48.h * 0x100000001b3 ^ (ulong)create_info->pCorrelatedViewMasks[uVar7];
      }
      bVar4 = hash_pnext_chain((StateRecorder *)0x0,&local_48,create_info->pNext,
                               (DynamicStateInfo *)0x0,0);
      if (bVar4) {
        *local_38 = local_48.h;
        return true;
      }
      return false;
    }
    pVVar3 = create_info->pSubpasses;
    local_48.h = ((((local_48.h * 0x100000001b3 ^ (ulong)pVVar3[local_40].flags) * 0x100000001b3 ^
                   (ulong)pVVar3[local_40].colorAttachmentCount) * 0x100000001b3 ^
                  (ulong)pVVar3[local_40].inputAttachmentCount) * 0x100000001b3 ^
                 (ulong)pVVar3[local_40].preserveAttachmentCount) * 0x100000001b3 ^
                 (ulong)pVVar3[local_40].pipelineBindPoint;
    for (uVar6 = 0; pVVar3[local_40].preserveAttachmentCount != uVar6; uVar6 = uVar6 + 1) {
      local_48.h = local_48.h * 0x100000001b3 ^ (ulong)pVVar3[local_40].pPreserveAttachments[uVar6];
    }
    uVar6 = 0xffffffffffffffff;
    lVar5 = 0;
    while (uVar6 = uVar6 + 1, uVar6 < pVVar3[uVar7].colorAttachmentCount) {
      bVar4 = hash_reference_base(&local_48,
                                  (VkAttachmentReference2 *)
                                  ((long)&(pVVar3[uVar7].pColorAttachments)->sType + lVar5));
      lVar5 = lVar5 + 0x20;
      if (!bVar4) {
        return false;
      }
    }
    uVar6 = 0xffffffffffffffff;
    lVar5 = 0;
    while (uVar6 = uVar6 + 1, uVar6 < pVVar3[uVar7].inputAttachmentCount) {
      bVar4 = hash_reference_base(&local_48,
                                  (VkAttachmentReference2 *)
                                  ((long)&(pVVar3[uVar7].pInputAttachments)->sType + lVar5));
      lVar5 = lVar5 + 0x20;
      if (!bVar4) {
        return false;
      }
    }
    if (pVVar3[uVar7].pResolveAttachments != (VkAttachmentReference2 *)0x0) {
      uVar6 = 0xffffffffffffffff;
      lVar5 = 0;
      while (uVar6 = uVar6 + 1, uVar6 < pVVar3[uVar7].colorAttachmentCount) {
        bVar4 = hash_reference_base(&local_48,
                                    (VkAttachmentReference2 *)
                                    ((long)&(pVVar3[uVar7].pResolveAttachments)->sType + lVar5));
        lVar5 = lVar5 + 0x20;
        if (!bVar4) {
          return false;
        }
      }
    }
    if (pVVar3[uVar7].pDepthStencilAttachment == (VkAttachmentReference2 *)0x0) {
      local_48.h = local_48.h * 0x100000001b3;
    }
    else {
      bVar4 = hash_reference_base(&local_48,pVVar3[uVar7].pDepthStencilAttachment);
      if (!bVar4) {
        return false;
      }
    }
    local_48.h = local_48.h * 0x100000001b3 ^ (ulong)pVVar3[uVar7].viewMask;
    bVar4 = hash_pnext_chain((StateRecorder *)0x0,&local_48,pVVar3[uVar7].pNext,
                             (DynamicStateInfo *)0x0,0);
    local_40 = local_40 + 1;
  } while (bVar4);
  return false;
}

Assistant:

bool compute_hash_render_pass2(const VkRenderPassCreateInfo2 &create_info, Hash *out_hash)
{
	Hasher h;

	h.u32(create_info.flags);
	h.u32(create_info.attachmentCount);
	h.u32(create_info.dependencyCount);
	h.u32(create_info.subpassCount);
	h.u32(create_info.correlatedViewMaskCount);
	h.u32(2);

	for (uint32_t i = 0; i < create_info.attachmentCount; i++)
	{
		auto &att = create_info.pAttachments[i];
		if (!hash_attachment2(h, att))
			return false;
	}

	for (uint32_t i = 0; i < create_info.dependencyCount; i++)
	{
		auto &dep = create_info.pDependencies[i];
		if (!hash_dependency2(h, dep))
			return false;
	}

	for (uint32_t i = 0; i < create_info.subpassCount; i++)
	{
		auto &subpass = create_info.pSubpasses[i];
		if (!hash_subpass2(h, subpass))
			return false;
	}

	for (uint32_t i = 0; i < create_info.correlatedViewMaskCount; i++)
		h.u32(create_info.pCorrelatedViewMasks[i]);

	if (!hash_pnext_chain(nullptr, h, create_info.pNext, nullptr, 0))
		return false;

	*out_hash = h.get();
	return true;
}